

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso3.c
# Opt level: O3

void Gia_Iso3Test(Gia_Man_t *p)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  Vec_Int_t *vSign;
  int *__ptr;
  void *__s;
  void *__s_00;
  byte bVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  size_t __size;
  int c;
  undefined4 *puVar9;
  ulong uVar10;
  int *piVar11;
  uint uVar12;
  long lVar13;
  ulong uVar14;
  timespec ts;
  long local_50;
  timespec local_48;
  size_t local_38;
  
  iVar1 = clock_gettime(3,&local_48);
  if (iVar1 < 0) {
    local_50 = 1;
  }
  else {
    lVar7 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_48.tv_nsec),8);
    local_50 = ((lVar7 >> 7) - (lVar7 >> 0x3f)) + local_48.tv_sec * -1000000;
  }
  Gia_Iso3Init(p);
  uVar12 = 0;
  iVar1 = -1;
  do {
    iVar3 = p->nObjs;
    vSign = (Vec_Int_t *)malloc(0x10);
    iVar5 = iVar3;
    if (iVar3 - 1U < 0xf) {
      iVar5 = 0x10;
    }
    vSign->nSize = 0;
    vSign->nCap = iVar5;
    if (iVar5 == 0) {
      __ptr = (int *)0x0;
    }
    else {
      __ptr = (int *)malloc((long)iVar5 << 2);
    }
    vSign->pArray = __ptr;
    if (iVar3 < 1) {
      uVar14 = 0;
      bVar4 = 0;
    }
    else {
      lVar7 = 8;
      lVar13 = 0;
      do {
        uVar2 = vSign->nSize;
        uVar14 = (ulong)uVar2;
        if (p->pObjs == (Gia_Obj_t *)0x0) goto LAB_00704088;
        iVar3 = *(int *)(&p->pObjs->field_0x0 + lVar7);
        if (uVar2 == vSign->nCap) {
          if ((int)uVar2 < 0x10) {
            if (__ptr == (int *)0x0) {
              __ptr = (int *)malloc(0x40);
            }
            else {
              __ptr = (int *)realloc(__ptr,0x40);
            }
            vSign->pArray = __ptr;
            iVar5 = 0x10;
            if (__ptr == (int *)0x0) {
LAB_007042f9:
              __assert_fail("p->pArray",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                            ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
            }
          }
          else {
            if (__ptr == (int *)0x0) {
              __ptr = (int *)malloc(uVar14 * 8);
            }
            else {
              __ptr = (int *)realloc(__ptr,uVar14 * 8);
            }
            vSign->pArray = __ptr;
            if (__ptr == (int *)0x0) goto LAB_007042f9;
            iVar5 = uVar2 * 2;
          }
          vSign->nCap = iVar5;
        }
        vSign->nSize = uVar2 + 1;
        __ptr[(int)uVar2] = iVar3;
        lVar13 = lVar13 + 1;
        lVar7 = lVar7 + 0xc;
      } while (lVar13 < p->nObjs);
      uVar14 = (ulong)(uint)vSign->nSize;
LAB_00704088:
      uVar2 = (uint)uVar14 - 1;
      iVar3 = 0x1f;
      if (uVar2 != 0) {
        for (; uVar2 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      uVar8 = (ulong)(iVar3 + 0x21);
      if ((uint)uVar14 < 2) {
        uVar8 = uVar14;
      }
      bVar4 = (byte)uVar8;
    }
    iVar3 = 1 << (bVar4 & 0x1f);
    __size = (long)iVar3 << 2;
    local_38 = __size;
    __s = malloc(__size);
    memset(__s,0xff,__size);
    __s_00 = malloc(__size);
    memset(__s_00,0xff,local_38);
    uVar8 = 0;
    if (0 < (int)(uint)uVar14) {
      uVar6 = 0;
      uVar8 = 0;
      piVar11 = __ptr;
      do {
        if (uVar6 == uVar14) {
LAB_007042da:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                        ,0x1af,"int *Vec_IntEntryP(Vec_Int_t *, int)");
        }
        lVar7 = 0;
        uVar2 = 0;
        do {
          uVar2 = *(int *)(Vec_IntUniqueHashKey_s_BigPrimes +
                          (ulong)(*(byte *)((long)piVar11 + lVar7) >> 4) * 4) *
                  (&DAT_0098bb74)[lVar7 * 2] +
                  *(int *)(Vec_IntUniqueHashKey_s_BigPrimes +
                          (ulong)(*(byte *)((long)piVar11 + lVar7) & 0xf) * 4) *
                  (&Vec_IntUniqueHashKey_s_BigPrimes2)[lVar7 * 2] + uVar2;
          lVar7 = lVar7 + 1;
        } while (lVar7 != 4);
        lVar7 = (long)(int)(uVar2 & iVar3 - 1U);
        uVar2 = *(uint *)((long)__s + lVar7 * 4);
        if (uVar2 == 0xffffffff) {
          puVar9 = (undefined4 *)((long)__s + lVar7 * 4);
        }
        else {
          do {
            if (((int)uVar2 < 0) || ((uint)uVar14 <= uVar2)) goto LAB_007042da;
            uVar10 = (ulong)uVar2;
            if (__ptr[uVar6] == __ptr[uVar10]) goto LAB_00704197;
            uVar2 = *(uint *)((long)__s_00 + uVar10 * 4);
          } while (uVar2 != 0xffffffff);
          puVar9 = (undefined4 *)((long)__s_00 + uVar10 * 4);
        }
        *puVar9 = (int)uVar6;
        uVar8 = (ulong)((int)uVar8 + 1);
LAB_00704197:
        uVar6 = uVar6 + 1;
        piVar11 = piVar11 + 1;
      } while (uVar6 != uVar14);
    }
    if (__s != (void *)0x0) {
      free(__s);
    }
    if (__s_00 != (void *)0x0) {
      free(__s_00);
    }
    printf("Iter %3d : %6d  out of %6d  ",(ulong)uVar12,uVar8,uVar14);
    iVar5 = 3;
    iVar3 = clock_gettime(3,&local_48);
    if (iVar3 < 0) {
      lVar7 = -1;
    }
    else {
      lVar7 = local_48.tv_nsec / 1000 + local_48.tv_sec * 1000000;
    }
    Abc_Print(iVar5,"%s =","Time");
    Abc_Print(iVar5,"%9.2f sec\n",(double)(lVar7 + local_50) / 1000000.0);
    if ((int)uVar8 == iVar1) {
      if (__ptr != (int *)0x0) {
        free(__ptr);
        vSign->pArray = (int *)0x0;
      }
      free(vSign);
      return;
    }
    Gia_Iso3Compute(p,vSign);
    if (__ptr != (int *)0x0) {
      free(__ptr);
    }
    free(vSign);
    uVar12 = uVar12 + 1;
    iVar1 = (int)uVar8;
    if (uVar12 == 500) {
      return;
    }
  } while( true );
}

Assistant:

void Gia_Iso3Test( Gia_Man_t * p )
{
    int nIterMax = 500;
    int i, Prev = -1, This; 
    abctime clk = Abc_Clock();
    Vec_Int_t * vSign = NULL;
    Gia_Iso3Init( p );
    for ( i = 0; i < nIterMax; i++ )
    {
        vSign = Gia_Iso3Save( p );
//        This = Gia_Iso3Unique( vSign );
        This = Vec_IntUniqueCount( vSign, 1, NULL );
        printf( "Iter %3d : %6d  out of %6d  ", i, This, Vec_IntSize(vSign) );
        Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
        if ( This == Prev )
            break;
        Prev = This;
        Gia_Iso3Compute( p, vSign );
        Vec_IntFreeP( &vSign );
    }
    Vec_IntFreeP( &vSign );
}